

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::buffer_is_packing_standard
          (CompilerGLSL *this,SPIRType *type,BufferPackingStandard packing,
          uint32_t *failed_validation_index,uint32_t start_offset,uint32_t end_offset)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  BufferPackingStandard packing_00;
  size_t sVar5;
  TypedID *this_00;
  mapped_type *pmVar6;
  Decoration *pDVar7;
  uint *puVar8;
  byte local_f9;
  bool local_d1;
  BufferPackingStandard substruct_packing;
  uint32_t alignment;
  uint local_c0;
  uint local_bc;
  uint32_t end_word;
  uint32_t begin_word;
  uint32_t actual_offset;
  uint32_t packed_size;
  bool member_can_be_unsized;
  uint32_t local_9c;
  undefined1 local_98 [4];
  uint32_t packed_alignment;
  Bitset member_flags;
  SPIRType *memb_type;
  uint32_t i;
  uint local_40;
  uint uStack_3c;
  bool is_top_level_block;
  uint32_t pad_alignment;
  uint32_t offset;
  uint32_t end_offset_local;
  uint32_t start_offset_local;
  uint32_t *failed_validation_index_local;
  SPIRType *pSStack_20;
  BufferPackingStandard packing_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  uStack_3c = 0;
  local_40 = 1;
  pad_alignment = end_offset;
  offset = start_offset;
  _end_offset_local = failed_validation_index;
  failed_validation_index_local._4_4_ = packing;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  bVar2 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  local_d1 = true;
  if (!bVar2) {
    local_d1 = Compiler::has_decoration
                         (&this->super_Compiler,(ID)(pSStack_20->super_IVariant).self.id,
                          DecorationBufferBlock);
  }
  memb_type._0_4_ = 0;
  do {
    sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(pSStack_20->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    if (sVar5 <= (uint)memb_type) {
LAB_00352899:
      this_local._7_1_ = 1;
LAB_0035289d:
      return (bool)(this_local._7_1_ & 1);
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(pSStack_20->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)(uint)memb_type);
    uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
    member_flags.higher._M_h._M_single_bucket =
         (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    pmVar6 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_20->super_IVariant).self);
    pDVar7 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)(uint)memb_type);
    Bitset::Bitset((Bitset *)local_98,&pDVar7->decoration_flags);
    local_9c = type_to_packed_alignment
                         (this,(SPIRType *)member_flags.higher._M_h._M_single_bucket,
                          (Bitset *)local_98,failed_validation_index_local._4_4_);
    local_f9 = 0;
    if (local_d1 != false) {
      sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(pSStack_20->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      local_f9 = 0;
      if ((uint)memb_type + 1 == sVar5) {
        bVar2 = VectorView<unsigned_int>::empty
                          ((VectorView<unsigned_int> *)
                           (member_flags.higher._M_h._M_single_bucket + 4));
        local_f9 = bVar2 ^ 0xff;
      }
    }
    actual_offset._3_1_ = local_f9 & 1;
    begin_word = 0;
    if ((actual_offset._3_1_ == 0) ||
       (bVar2 = packing_is_hlsl(failed_validation_index_local._4_4_), bVar2)) {
      begin_word = type_to_packed_size(this,(SPIRType *)member_flags.higher._M_h._M_single_bucket,
                                       (Bitset *)local_98,failed_validation_index_local._4_4_);
    }
    end_word = Compiler::type_struct_member_offset(&this->super_Compiler,pSStack_20,(uint)memb_type)
    ;
    bVar2 = packing_is_hlsl(failed_validation_index_local._4_4_);
    if (bVar2) {
      local_bc = end_word >> 4;
      local_c0 = (end_word + begin_word) - 1 >> 4;
      if (local_bc != local_c0) {
        alignment = 0x10;
        puVar8 = ::std::max<unsigned_int>(&local_9c,&alignment);
        local_9c = *puVar8;
      }
    }
    if (pad_alignment <= end_word) {
      substruct_packing = BufferPackingStd140EnhancedLayout;
      goto LAB_0035285c;
    }
    puVar8 = ::std::max<unsigned_int>(&local_9c,&local_40);
    uVar1 = *puVar8;
    uStack_3c = (uStack_3c + uVar1) - 1 & (uVar1 - 1 ^ 0xffffffff);
    if ((*(int *)((long)&member_flags.higher._M_h._M_single_bucket[1]._M_nxt + 4) == 0xf) &&
       (((ulong)member_flags.higher._M_h._M_single_bucket[0xf]._M_nxt & 0x100000000) == 0)) {
      local_40 = local_9c;
    }
    else {
      local_40 = 1;
    }
    if (end_word < offset) {
LAB_00352843:
      uStack_3c = end_word + begin_word;
      substruct_packing = BufferPackingStd140;
    }
    else {
      bVar2 = packing_has_flexible_offset(failed_validation_index_local._4_4_);
      if (bVar2) {
        if ((end_word & uVar1 - 1) == 0) goto LAB_0035271d;
        if (_end_offset_local != (uint32_t *)0x0) {
          *_end_offset_local = (uint)memb_type;
        }
        this_local._7_1_ = 0;
        substruct_packing = BufferPackingStd430;
      }
      else if (end_word == uStack_3c) {
LAB_0035271d:
        bVar2 = Compiler::type_is_top_level_array
                          (&this->super_Compiler,
                           (SPIRType *)member_flags.higher._M_h._M_single_bucket);
        if (bVar2) {
          uVar3 = type_to_packed_array_stride
                            (this,(SPIRType *)member_flags.higher._M_h._M_single_bucket,
                             (Bitset *)local_98,failed_validation_index_local._4_4_);
          uVar4 = Compiler::type_struct_member_array_stride
                            (&this->super_Compiler,pSStack_20,(uint)memb_type);
          if (uVar3 != uVar4) {
            if (_end_offset_local != (uint32_t *)0x0) {
              *_end_offset_local = (uint)memb_type;
            }
            this_local._7_1_ = 0;
            substruct_packing = BufferPackingStd430;
            goto LAB_0035285c;
          }
        }
        packing_00 = packing_to_substruct_packing(failed_validation_index_local._4_4_);
        if (((((ulong)member_flags.higher._M_h._M_single_bucket[0xf]._M_nxt & 0x100000000) != 0) ||
            (bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                               ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                (member_flags.higher._M_h._M_single_bucket + 0x11)), bVar2)) ||
           (bVar2 = buffer_is_packing_standard
                              (this,(SPIRType *)member_flags.higher._M_h._M_single_bucket,packing_00
                               ,(uint32_t *)0x0,0,0xffffffff), bVar2)) goto LAB_00352843;
        if (_end_offset_local != (uint32_t *)0x0) {
          *_end_offset_local = (uint)memb_type;
        }
        this_local._7_1_ = 0;
        substruct_packing = BufferPackingStd430;
      }
      else {
        if (_end_offset_local != (uint32_t *)0x0) {
          *_end_offset_local = (uint)memb_type;
        }
        this_local._7_1_ = 0;
        substruct_packing = BufferPackingStd430;
      }
    }
LAB_0035285c:
    Bitset::~Bitset((Bitset *)local_98);
    if (substruct_packing != BufferPackingStd140) {
      if (substruct_packing == BufferPackingStd430) goto LAB_0035289d;
      goto LAB_00352899;
    }
    memb_type._0_4_ = (uint)memb_type + 1;
  } while( true );
}

Assistant:

bool CompilerGLSL::buffer_is_packing_standard(const SPIRType &type, BufferPackingStandard packing,
                                              uint32_t *failed_validation_index, uint32_t start_offset,
                                              uint32_t end_offset)
{
	// This is very tricky and error prone, but try to be exhaustive and correct here.
	// SPIR-V doesn't directly say if we're using std430 or std140.
	// SPIR-V communicates this using Offset and ArrayStride decorations (which is what really matters),
	// so we have to try to infer whether or not the original GLSL source was std140 or std430 based on this information.
	// We do not have to consider shared or packed since these layouts are not allowed in Vulkan SPIR-V (they are useless anyways, and custom offsets would do the same thing).
	//
	// It is almost certain that we're using std430, but it gets tricky with arrays in particular.
	// We will assume std430, but infer std140 if we can prove the struct is not compliant with std430.
	//
	// The only two differences between std140 and std430 are related to padding alignment/array stride
	// in arrays and structs. In std140 they take minimum vec4 alignment.
	// std430 only removes the vec4 requirement.

	uint32_t offset = 0;
	uint32_t pad_alignment = 1;

	bool is_top_level_block =
	    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		auto &memb_type = get<SPIRType>(type.member_types[i]);
		auto member_flags = ir.meta[type.self].members[i].decoration_flags;

		// Verify alignment rules.
		uint32_t packed_alignment = type_to_packed_alignment(memb_type, member_flags, packing);

		// This is a rather dirty workaround to deal with some cases of OpSpecConstantOp used as array size, e.g:
		// layout(constant_id = 0) const int s = 10;
		// const int S = s + 5; // SpecConstantOp
		// buffer Foo { int data[S]; }; // <-- Very hard for us to deduce a fixed value here,
		// we would need full implementation of compile-time constant folding. :(
		// If we are the last member of a struct, there might be cases where the actual size of that member is irrelevant
		// for our analysis (e.g. unsized arrays).
		// This lets us simply ignore that there are spec constant op sized arrays in our buffers.
		// Querying size of this member will fail, so just don't call it unless we have to.
		//
		// This is likely "best effort" we can support without going into unacceptably complicated workarounds.
		bool member_can_be_unsized =
		    is_top_level_block && size_t(i + 1) == type.member_types.size() && !memb_type.array.empty();

		uint32_t packed_size = 0;
		if (!member_can_be_unsized || packing_is_hlsl(packing))
			packed_size = type_to_packed_size(memb_type, member_flags, packing);

		// We only need to care about this if we have non-array types which can straddle the vec4 boundary.
		uint32_t actual_offset = type_struct_member_offset(type, i);

		if (packing_is_hlsl(packing))
		{
			// If a member straddles across a vec4 boundary, alignment is actually vec4.
			uint32_t begin_word = actual_offset / 16;
			uint32_t end_word = (actual_offset + packed_size - 1) / 16;
			if (begin_word != end_word)
				packed_alignment = max<uint32_t>(packed_alignment, 16u);
		}

		// Field is not in the specified range anymore and we can ignore any further fields.
		if (actual_offset >= end_offset)
			break;

		uint32_t alignment = max(packed_alignment, pad_alignment);
		offset = (offset + alignment - 1) & ~(alignment - 1);

		// The next member following a struct member is aligned to the base alignment of the struct that came before.
		// GL 4.5 spec, 7.6.2.2.
		if (memb_type.basetype == SPIRType::Struct && !memb_type.pointer)
			pad_alignment = packed_alignment;
		else
			pad_alignment = 1;

		// Only care about packing if we are in the given range
		if (actual_offset >= start_offset)
		{
			// We only care about offsets in std140, std430, etc ...
			// For EnhancedLayout variants, we have the flexibility to choose our own offsets.
			if (!packing_has_flexible_offset(packing))
			{
				if (actual_offset != offset) // This cannot be the packing we're looking for.
				{
					if (failed_validation_index)
						*failed_validation_index = i;
					return false;
				}
			}
			else if ((actual_offset & (alignment - 1)) != 0)
			{
				// We still need to verify that alignment rules are observed, even if we have explicit offset.
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}

			// Verify array stride rules.
			if (type_is_top_level_array(memb_type) &&
			    type_to_packed_array_stride(memb_type, member_flags, packing) !=
			    type_struct_member_array_stride(type, i))
			{
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}

			// Verify that sub-structs also follow packing rules.
			// We cannot use enhanced layouts on substructs, so they better be up to spec.
			auto substruct_packing = packing_to_substruct_packing(packing);

			if (!memb_type.pointer && !memb_type.member_types.empty() &&
			    !buffer_is_packing_standard(memb_type, substruct_packing))
			{
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}
		}

		// Bump size.
		offset = actual_offset + packed_size;
	}

	return true;
}